

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O1

object * fix_offset(object *old,int64_t offset)

{
  object *poVar1;
  
  poVar1 = (object *)(&old->header + offset);
  if ((long)poVar1 < (long)memoryPointer || (long)memoryTop <= (long)poVar1) {
    info_impl("fix_offset",0x3c1,
              "!!! old pointer=%p, offset=%ld, low bound=%p, high bound=%p, new pointer=%p",old,
              offset,memoryPointer,memoryTop,poVar1);
    error_impl("fix_offset",0x3c2,
               "fix_offset(): swizzled pointer from image does not point into new address range! oop=%p"
               ,poVar1);
  }
  return poVar1;
}

Assistant:

struct object *fix_offset(struct object *old, int64_t offset)
{
    struct object *tmp;

    /* sanity checking, is the old pointer in the old image range? */
//    if(!PTR_BETWEEN(old, imagePointer, imageTop)) {
//        fprintf(stderr, "!!! old pointer=%p, low bound=%p, high bound=%p\n", (void *)old, (void *)imagePointer, (void *)imageTop);
//        sysErrorInt("pointer from image is not within image address range! oop=", (intptr_t)old);
//    }

    tmp = (struct object *)((intptr_t)old + ((intptr_t)offset * (intptr_t)BytesPerWord));

    /* sanity checking, is the new pointer in the new memory range? */
    if(!PTR_BETWEEN(tmp, memoryPointer, memoryTop)) {
        info("!!! old pointer=%p, offset=%ld, low bound=%p, high bound=%p, new pointer=%p", (void *)old, offset, (void *)memoryPointer, (void *)memoryTop, (void *)tmp);
        error("fix_offset(): swizzled pointer from image does not point into new address range! oop=%p", (intptr_t)tmp);
    }

    return tmp;
}